

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void sync_read(AV1LfSync *lf_sync,int r,int c,int plane)

{
  int iVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  
  if ((r != 0) && (iVar1 = lf_sync->sync_range, (iVar1 - 1U & c) == 0)) {
    iVar2 = r + -1;
    __mutex = lf_sync->mutex_[plane] + iVar2;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (lf_sync->cur_sb_col[plane][iVar2] - iVar1 < c) {
      pthread_cond_wait((pthread_cond_t *)(lf_sync->cond_[plane] + iVar2),(pthread_mutex_t *)__mutex
                       );
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  return;
}

Assistant:

static inline void sync_read(AV1LfSync *const lf_sync, int r, int c,
                             int plane) {
#if CONFIG_MULTITHREAD
  const int nsync = lf_sync->sync_range;

  if (r && !(c & (nsync - 1))) {
    pthread_mutex_t *const mutex = &lf_sync->mutex_[plane][r - 1];
    pthread_mutex_lock(mutex);

    while (c > lf_sync->cur_sb_col[plane][r - 1] - nsync) {
      pthread_cond_wait(&lf_sync->cond_[plane][r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)lf_sync;
  (void)r;
  (void)c;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}